

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ggml-cpu-quants.c
# Opt level: O0

void ggml_vec_dot_iq1_m_q8_K(int n,float *s,size_t bs,void *vx,size_t bx,void *vy,size_t by,int nrc)

{
  ulong *puVar1;
  byte bVar2;
  ushort uVar3;
  ushort uVar4;
  undefined1 auVar5 [16];
  undefined1 auVar6 [16];
  undefined1 auVar7 [16];
  undefined1 auVar8 [16];
  undefined1 auVar9 [16];
  undefined1 auVar10 [32];
  undefined1 auVar11 [32];
  undefined1 auVar12 [32];
  undefined1 auVar13 [32];
  undefined1 auVar14 [32];
  undefined1 auVar15 [32];
  undefined1 auVar16 [32];
  ulong uVar17;
  ulong uVar18;
  __m256 x_00;
  __m256 x_01;
  __m256i y_00;
  __m256i y_01;
  __m256i x_02;
  __m256i x_03;
  undefined1 auVar19 [32];
  undefined1 auVar20 [32];
  undefined1 auVar21 [32];
  undefined1 auVar22 [32];
  undefined1 auVar23 [32];
  undefined1 auVar24 [32];
  undefined1 auVar25 [32];
  undefined1 auVar26 [32];
  undefined1 auVar27 [32];
  ulong uVar28;
  ulong uVar29;
  ulong uVar30;
  long in_RCX;
  ulong uVar31;
  undefined4 *in_RSI;
  int in_EDI;
  long in_R9;
  float fVar32;
  undefined1 auVar33 [16];
  undefined1 auVar34 [16];
  undefined1 auVar35 [16];
  undefined1 auVar36 [64];
  undefined1 auVar37 [16];
  undefined1 auVar38 [16];
  undefined1 auVar39 [16];
  undefined1 auVar40 [16];
  undefined1 auVar41 [16];
  undefined1 auVar42 [16];
  undefined1 auVar43 [16];
  undefined1 auVar44 [16];
  undefined1 auVar45 [16];
  __m256 d;
  __m256i p4;
  __m256i p3;
  __m256i p2;
  __m256i p1;
  __m256i scale2;
  __m256i scale1;
  __m256i dot4;
  __m256i dot3;
  __m256i dot2;
  __m256i dot1;
  __m256i q8b_2;
  __m256i q8b_1;
  __m256i delta2;
  __m256i delta1;
  uint64_t delta_sign;
  __m256i q1b_2;
  __m256i q1b_1;
  uint16_t *idx2;
  uint16_t *idx1;
  uint64_t packed_idx2;
  uint64_t packed_idx1;
  int ib;
  __m256i sumi2;
  __m256i sumi1;
  __m256i scales_idx2;
  __m256i scales_idx1;
  __m256i scales;
  uint16_t *sc;
  uint8_t *qh;
  uint8_t *qs;
  int8_t *q8;
  int i;
  __m256 accum2;
  __m256 accum1;
  __m256i scales_shift;
  __m256i mtwo8;
  __m256i mone8;
  __m256i mone;
  __m256i mask;
  iq1m_scale_t scale;
  int nb;
  block_q8_K *y;
  block_iq1_m *x;
  undefined4 in_stack_ffffffffffffefb8;
  undefined4 in_stack_ffffffffffffefbc;
  float in_stack_ffffffffffffefc0;
  float in_stack_ffffffffffffefc4;
  uint64_t *in_stack_ffffffffffffefc8;
  undefined6 in_stack_ffffffffffffefd0;
  undefined2 in_stack_ffffffffffffefd6;
  undefined1 in_stack_ffffffffffffefd8;
  undefined1 uVar46;
  undefined2 uVar47;
  undefined2 uVar48;
  undefined1 uVar49;
  undefined1 uVar50;
  undefined8 in_stack_ffffffffffffefe0;
  undefined8 in_stack_ffffffffffffefe8;
  longlong in_stack_ffffffffffffeff0;
  undefined8 in_stack_ffffffffffffeff8;
  undefined8 in_stack_fffffffffffff000;
  undefined8 in_stack_fffffffffffff008;
  longlong in_stack_fffffffffffff010;
  uint local_e28;
  uint uStack_e24;
  int local_da4;
  undefined1 local_da0 [32];
  undefined1 local_d80 [32];
  undefined1 local_d60 [32];
  undefined1 local_d40 [32];
  uint *local_ce0;
  uint *local_cd8;
  undefined1 (*local_cd0) [32];
  int local_cc4;
  undefined1 local_cc0 [32];
  undefined1 local_ca0 [32];
  undefined8 uStack_670;
  undefined8 uStack_668;
  undefined8 uStack_610;
  undefined8 uStack_608;
  undefined8 uStack_5b0;
  undefined8 uStack_5a8;
  undefined8 local_380;
  undefined8 uStack_378;
  undefined8 uStack_370;
  undefined8 uStack_368;
  undefined8 local_340;
  undefined8 uStack_338;
  undefined8 uStack_330;
  undefined8 uStack_328;
  undefined8 uStack_2f0;
  undefined8 uStack_2e8;
  undefined8 uStack_1d0;
  undefined8 uStack_1c8;
  uint local_160;
  uint local_150;
  undefined8 local_140;
  undefined8 uStack_138;
  longlong lStack_130;
  undefined8 uStack_128;
  undefined8 uStack_f0;
  undefined8 uStack_e8;
  undefined8 uStack_b0;
  undefined8 uStack_a8;
  undefined8 uStack_70;
  undefined8 uStack_68;
  undefined1 extraout_var [60];
  
  if (in_EDI < 0) {
    in_EDI = in_EDI + 0xff;
  }
  uVar47 = 7;
  auVar7 = vpinsrw_avx(ZEXT216(7),7,1);
  auVar7 = vpinsrw_avx(auVar7,7,2);
  auVar7 = vpinsrw_avx(auVar7,7,3);
  auVar7 = vpinsrw_avx(auVar7,7,4);
  auVar7 = vpinsrw_avx(auVar7,7,5);
  auVar7 = vpinsrw_avx(auVar7,7,6);
  auVar8 = vpinsrw_avx(auVar7,7,7);
  auVar7 = vpinsrw_avx(ZEXT216(7),7,1);
  auVar7 = vpinsrw_avx(auVar7,7,2);
  auVar7 = vpinsrw_avx(auVar7,7,3);
  auVar7 = vpinsrw_avx(auVar7,7,4);
  auVar7 = vpinsrw_avx(auVar7,7,5);
  auVar7 = vpinsrw_avx(auVar7,7,6);
  auVar7 = vpinsrw_avx(auVar7,7,7);
  uStack_5b0 = auVar7._0_8_;
  uStack_5a8 = auVar7._8_8_;
  uVar48 = 1;
  auVar7 = vpinsrw_avx(ZEXT216(1),1,1);
  auVar7 = vpinsrw_avx(auVar7,1,2);
  auVar7 = vpinsrw_avx(auVar7,1,3);
  auVar7 = vpinsrw_avx(auVar7,1,4);
  auVar7 = vpinsrw_avx(auVar7,1,5);
  auVar7 = vpinsrw_avx(auVar7,1,6);
  auVar9 = vpinsrw_avx(auVar7,1,7);
  auVar7 = vpinsrw_avx(ZEXT216(1),1,1);
  auVar7 = vpinsrw_avx(auVar7,1,2);
  auVar7 = vpinsrw_avx(auVar7,1,3);
  auVar7 = vpinsrw_avx(auVar7,1,4);
  auVar7 = vpinsrw_avx(auVar7,1,5);
  auVar7 = vpinsrw_avx(auVar7,1,6);
  auVar7 = vpinsrw_avx(auVar7,1,7);
  uStack_610 = auVar7._0_8_;
  uStack_608 = auVar7._8_8_;
  uVar49 = 1;
  auVar7 = vpinsrb_avx(ZEXT116(1),1,1);
  auVar7 = vpinsrb_avx(auVar7,1,2);
  auVar7 = vpinsrb_avx(auVar7,1,3);
  auVar7 = vpinsrb_avx(auVar7,1,4);
  auVar7 = vpinsrb_avx(auVar7,1,5);
  auVar7 = vpinsrb_avx(auVar7,1,6);
  auVar7 = vpinsrb_avx(auVar7,1,7);
  auVar7 = vpinsrb_avx(auVar7,1,8);
  auVar7 = vpinsrb_avx(auVar7,1,9);
  auVar7 = vpinsrb_avx(auVar7,1,10);
  auVar7 = vpinsrb_avx(auVar7,1,0xb);
  auVar7 = vpinsrb_avx(auVar7,1,0xc);
  auVar7 = vpinsrb_avx(auVar7,1,0xd);
  auVar7 = vpinsrb_avx(auVar7,1,0xe);
  auVar7 = vpinsrb_avx(auVar7,1,0xf);
  auVar5 = vpinsrb_avx(ZEXT116(1),1,1);
  auVar5 = vpinsrb_avx(auVar5,1,2);
  auVar5 = vpinsrb_avx(auVar5,1,3);
  auVar5 = vpinsrb_avx(auVar5,1,4);
  auVar5 = vpinsrb_avx(auVar5,1,5);
  auVar5 = vpinsrb_avx(auVar5,1,6);
  auVar5 = vpinsrb_avx(auVar5,1,7);
  auVar5 = vpinsrb_avx(auVar5,1,8);
  auVar5 = vpinsrb_avx(auVar5,1,9);
  auVar5 = vpinsrb_avx(auVar5,1,10);
  auVar5 = vpinsrb_avx(auVar5,1,0xb);
  auVar5 = vpinsrb_avx(auVar5,1,0xc);
  auVar5 = vpinsrb_avx(auVar5,1,0xd);
  auVar5 = vpinsrb_avx(auVar5,1,0xe);
  auVar5 = vpinsrb_avx(auVar5,1,0xf);
  uStack_f0 = auVar5._0_8_;
  uStack_e8 = auVar5._8_8_;
  uVar50 = 2;
  auVar5 = vpinsrb_avx(ZEXT116(2),2,1);
  auVar5 = vpinsrb_avx(auVar5,2,2);
  auVar5 = vpinsrb_avx(auVar5,2,3);
  auVar5 = vpinsrb_avx(auVar5,2,4);
  auVar5 = vpinsrb_avx(auVar5,2,5);
  auVar5 = vpinsrb_avx(auVar5,2,6);
  auVar5 = vpinsrb_avx(auVar5,2,7);
  auVar5 = vpinsrb_avx(auVar5,2,8);
  auVar5 = vpinsrb_avx(auVar5,2,9);
  auVar5 = vpinsrb_avx(auVar5,2,10);
  auVar5 = vpinsrb_avx(auVar5,2,0xb);
  auVar5 = vpinsrb_avx(auVar5,2,0xc);
  auVar5 = vpinsrb_avx(auVar5,2,0xd);
  auVar5 = vpinsrb_avx(auVar5,2,0xe);
  auVar5 = vpinsrb_avx(auVar5,2,0xf);
  auVar6 = vpinsrb_avx(ZEXT116(2),2,1);
  auVar6 = vpinsrb_avx(auVar6,2,2);
  auVar6 = vpinsrb_avx(auVar6,2,3);
  auVar6 = vpinsrb_avx(auVar6,2,4);
  auVar6 = vpinsrb_avx(auVar6,2,5);
  auVar6 = vpinsrb_avx(auVar6,2,6);
  auVar6 = vpinsrb_avx(auVar6,2,7);
  auVar6 = vpinsrb_avx(auVar6,2,8);
  auVar6 = vpinsrb_avx(auVar6,2,9);
  auVar6 = vpinsrb_avx(auVar6,2,10);
  auVar6 = vpinsrb_avx(auVar6,2,0xb);
  auVar6 = vpinsrb_avx(auVar6,2,0xc);
  auVar6 = vpinsrb_avx(auVar6,2,0xd);
  auVar6 = vpinsrb_avx(auVar6,2,0xe);
  auVar6 = vpinsrb_avx(auVar6,2,0xf);
  uStack_b0 = auVar6._0_8_;
  uStack_a8 = auVar6._8_8_;
  auVar6 = vpunpcklqdq_avx(ZEXT816(0),ZEXT816(6));
  auVar33 = vpunpcklqdq_avx(ZEXT816(3),ZEXT816(9));
  uStack_2f0 = auVar33._0_8_;
  uStack_2e8 = auVar33._8_8_;
  local_ca0._0_16_ = ZEXT816(0);
  local_cc0._0_16_ = ZEXT816(0);
  for (local_cc4 = 0; local_ca0 = ZEXT1632(local_ca0._0_16_), local_cc0 = ZEXT1632(local_cc0._0_16_)
      , local_cc4 < in_EDI >> 8; local_cc4 = local_cc4 + 1) {
    local_cd0 = (undefined1 (*) [32])(in_R9 + 4 + (long)local_cc4 * 0x124);
    local_cd8 = (uint *)(in_RCX + (long)local_cc4 * 0x38);
    local_ce0 = (uint *)(in_RCX + 0x20 + (long)local_cc4 * 0x38);
    puVar1 = (ulong *)(in_RCX + 0x30 + (long)local_cc4 * 0x38);
    uVar28 = *puVar1;
    bVar2 = *(byte *)((long)puVar1 + 3);
    uVar3 = *(ushort *)((long)puVar1 + 4);
    uVar4 = *(ushort *)((long)puVar1 + 6);
    uVar29 = *puVar1;
    auVar33._8_8_ = 0;
    auVar33._0_8_ = uVar29;
    auVar37._8_8_ = 0;
    auVar37._0_8_ = uVar29;
    auVar33 = vpunpcklqdq_avx(auVar33,auVar37);
    auVar38._8_8_ = 0;
    auVar38._0_8_ = uVar29;
    auVar43._8_8_ = 0;
    auVar43._0_8_ = uVar29;
    auVar37 = vpunpcklqdq_avx(auVar38,auVar43);
    uStack_1d0 = auVar37._0_8_;
    uStack_1c8 = auVar37._8_8_;
    auVar14._16_8_ = uStack_1d0;
    auVar14._0_16_ = auVar33;
    auVar14._24_8_ = uStack_1c8;
    auVar16._16_8_ = uStack_2f0;
    auVar16._0_16_ = auVar6;
    auVar16._24_8_ = uStack_2e8;
    auVar16 = vpsrlvq_avx2(auVar14,auVar16);
    auVar11._16_8_ = uStack_5b0;
    auVar11._0_16_ = auVar8;
    auVar11._24_8_ = uStack_5a8;
    auVar16 = vpand_avx2(auVar16,auVar11);
    auVar16 = vpsllw_avx2(auVar16,ZEXT416(1));
    auVar10._16_8_ = uStack_610;
    auVar10._0_16_ = auVar9;
    auVar10._24_8_ = uStack_608;
    auVar16 = vpaddw_avx2(auVar16,auVar10);
    in_stack_ffffffffffffefd6 = 0x100;
    auVar33 = vpinsrw_avx(ZEXT216(0x100),0x100,1);
    auVar33 = vpinsrw_avx(auVar33,0x100,2);
    auVar33 = vpinsrw_avx(auVar33,0x100,3);
    auVar33 = vpinsrw_avx(auVar33,0x100,4);
    auVar33 = vpinsrw_avx(auVar33,0x100,5);
    auVar33 = vpinsrw_avx(auVar33,0x100,6);
    local_d40._0_16_ = vpinsrw_avx(auVar33,0x100,7);
    auVar33 = vpinsrw_avx(ZEXT216(0x100),0x100,1);
    auVar33 = vpinsrw_avx(auVar33,0x100,2);
    auVar33 = vpinsrw_avx(auVar33,0x100,3);
    auVar33 = vpinsrw_avx(auVar33,0x100,4);
    auVar33 = vpinsrw_avx(auVar33,0x100,5);
    auVar33 = vpinsrw_avx(auVar33,0x100,6);
    auVar33 = vpinsrw_avx(auVar33,0x100,7);
    uStack_670 = auVar33._0_8_;
    uStack_668 = auVar33._8_8_;
    local_d40._16_8_ = uStack_670;
    local_d40._24_8_ = uStack_668;
    uVar46 = 8;
    auVar33 = vpinsrb_avx(ZEXT116(8),8,1);
    auVar33 = vpinsrb_avx(auVar33,8,2);
    auVar33 = vpinsrb_avx(auVar33,8,3);
    auVar33 = vpinsrb_avx(auVar33,8,4);
    auVar33 = vpinsrb_avx(auVar33,8,5);
    auVar33 = vpinsrb_avx(auVar33,8,6);
    auVar33 = vpinsrb_avx(auVar33,8,7);
    auVar33 = vpinsrb_avx(auVar33,8,8);
    auVar33 = vpinsrb_avx(auVar33,8,9);
    auVar33 = vpinsrb_avx(auVar33,8,10);
    auVar33 = vpinsrb_avx(auVar33,8,0xb);
    auVar33 = vpinsrb_avx(auVar33,8,0xc);
    auVar33 = vpinsrb_avx(auVar33,8,0xd);
    auVar33 = vpinsrb_avx(auVar33,8,0xe);
    auVar33 = vpinsrb_avx(auVar33,8,0xf);
    auVar37 = vpinsrb_avx(ZEXT116(8),8,1);
    auVar37 = vpinsrb_avx(auVar37,8,2);
    auVar37 = vpinsrb_avx(auVar37,8,3);
    auVar37 = vpinsrb_avx(auVar37,8,4);
    auVar37 = vpinsrb_avx(auVar37,8,5);
    auVar37 = vpinsrb_avx(auVar37,8,6);
    auVar37 = vpinsrb_avx(auVar37,8,7);
    auVar37 = vpinsrb_avx(auVar37,8,8);
    auVar37 = vpinsrb_avx(auVar37,8,9);
    auVar37 = vpinsrb_avx(auVar37,8,10);
    auVar37 = vpinsrb_avx(auVar37,8,0xb);
    auVar37 = vpinsrb_avx(auVar37,8,0xc);
    auVar37 = vpinsrb_avx(auVar37,8,0xd);
    auVar37 = vpinsrb_avx(auVar37,8,0xe);
    auVar37 = vpinsrb_avx(auVar37,8,0xf);
    uStack_70 = auVar37._0_8_;
    uStack_68 = auVar37._8_8_;
    auVar13._16_8_ = uStack_670;
    auVar13._0_16_ = local_d40._0_16_;
    auVar13._24_8_ = uStack_668;
    auVar12._16_8_ = uStack_70;
    auVar12._0_16_ = auVar33;
    auVar12._24_8_ = uStack_68;
    local_d60 = vpaddb_avx2(auVar13,auVar12);
    local_d80 = ZEXT1632(ZEXT816(0));
    local_da0 = ZEXT1632(ZEXT816(0));
    for (local_da4 = 0; local_da4 < 8; local_da4 = local_da4 + 2) {
      uVar29 = (ulong)*local_cd8;
      uVar17 = 1;
      uVar31 = 0;
      do {
        if ((uVar17 & 0xff00ff00ff00ff) != 0) {
          uVar31 = uVar31 | (uVar17 & 0xff00ff00ff00ff) * (uVar29 & 1);
          uVar29 = uVar29 >> 1;
        }
        uVar17 = uVar17 << 1;
      } while (uVar17 != 0);
      uVar29 = (ulong)((ushort)*local_ce0 & 0x7777);
      uVar17 = 1;
      uVar30 = 0;
      do {
        if ((uVar17 & 0xf000f000f000f00) != 0) {
          uVar30 = uVar30 | (uVar17 & 0xf000f000f000f00) * (uVar29 & 1);
          uVar29 = uVar29 >> 1;
        }
        uVar17 = uVar17 << 1;
      } while (uVar17 != 0);
      uVar31 = uVar31 | uVar30;
      uVar29 = (ulong)local_cd8[1];
      uVar17 = 1;
      uVar30 = 0;
      do {
        if ((uVar17 & 0xff00ff00ff00ff) != 0) {
          uVar30 = uVar30 | (uVar17 & 0xff00ff00ff00ff) * (uVar29 & 1);
          uVar29 = uVar29 >> 1;
        }
        uVar17 = uVar17 << 1;
      } while (uVar17 != 0);
      uVar29 = (ulong)(*(ushort *)((long)local_ce0 + 2) & 0x7777);
      uVar17 = 1;
      uVar18 = 0;
      do {
        if ((uVar17 & 0xf000f000f000f00) != 0) {
          uVar18 = uVar18 | (uVar17 & 0xf000f000f000f00) * (uVar29 & 1);
          uVar29 = uVar29 >> 1;
        }
        uVar17 = uVar17 << 1;
      } while (uVar17 != 0);
      uVar30 = uVar30 | uVar18;
      in_stack_ffffffffffffefc8 = iq1s_grid;
      auVar34._8_8_ = 0;
      auVar34._0_8_ = iq1s_grid[uVar31 & 0xffff];
      auVar39._8_8_ = 0;
      auVar39._0_8_ = iq1s_grid[uVar31 >> 0x10 & 0xffff];
      auVar33 = vpunpcklqdq_avx(auVar34,auVar39);
      auVar40._8_8_ = 0;
      auVar40._0_8_ = iq1s_grid[uVar31 >> 0x20 & 0xffff];
      auVar44._8_8_ = 0;
      auVar44._0_8_ = iq1s_grid[uVar31 >> 0x30];
      auVar37 = vpunpcklqdq_avx(auVar40,auVar44);
      local_340 = auVar33._0_8_;
      uStack_338 = auVar33._8_8_;
      uStack_330 = auVar37._0_8_;
      uStack_328 = auVar37._8_8_;
      auVar35._8_8_ = 0;
      auVar35._0_8_ = iq1s_grid[uVar30 & 0xffff];
      auVar41._8_8_ = 0;
      auVar41._0_8_ = iq1s_grid[uVar30 >> 0x10 & 0xffff];
      auVar33 = vpunpcklqdq_avx(auVar35,auVar41);
      auVar42._8_8_ = 0;
      auVar42._0_8_ = iq1s_grid[uVar30 >> 0x20 & 0xffff];
      auVar45._8_8_ = 0;
      auVar45._0_8_ = iq1s_grid[uVar30 >> 0x30];
      auVar37 = vpunpcklqdq_avx(auVar42,auVar45);
      local_380 = auVar33._0_8_;
      uStack_378 = auVar33._8_8_;
      uStack_370 = auVar37._0_8_;
      uStack_368 = auVar37._8_8_;
      uVar29 = (ulong)(*local_ce0 & 0x88888888);
      uVar17 = 1;
      uVar31 = 0;
      do {
        if ((uVar17 & 0xf0f0f0f0f0f0f0f0) != 0) {
          uVar31 = uVar31 | (uVar17 & 0xf0f0f0f0f0f0f0f0) * (uVar29 & 1);
          uVar29 = uVar29 >> 1;
        }
        uVar17 = uVar17 << 1;
      } while (uVar17 != 0);
      local_e28 = (uint)uVar31;
      auVar33 = vpinsrd_avx(ZEXT416(local_e28),local_e28,1);
      auVar33 = vpinsrd_avx(auVar33,local_e28,2);
      auVar33 = vpinsrd_avx(auVar33,local_e28,3);
      local_150 = auVar33._0_4_;
      auVar11 = vpmovsxbq_avx2(ZEXT416(local_150));
      auVar21._16_8_ = uStack_f0;
      auVar21._0_16_ = auVar7;
      auVar21._24_8_ = uStack_e8;
      auVar12 = vpor_avx2(auVar21,auVar11);
      uStack_e24 = (uint)(uVar31 >> 0x20);
      auVar33 = vpinsrd_avx(ZEXT416(uStack_e24),uStack_e24,1);
      auVar33 = vpinsrd_avx(auVar33,uStack_e24,2);
      auVar33 = vpinsrd_avx(auVar33,uStack_e24,3);
      local_160 = auVar33._0_4_;
      auVar11 = vpmovsxbq_avx2(ZEXT416(local_160));
      auVar15._16_8_ = uStack_f0;
      auVar15._0_16_ = auVar7;
      auVar15._24_8_ = uStack_e8;
      auVar13 = vpor_avx2(auVar15,auVar11);
      auVar11 = *local_cd0;
      auVar10 = local_cd0[1];
      local_cd0 = local_cd0 + 2;
      x_02[1] = in_stack_fffffffffffff000;
      x_02[0] = in_stack_ffffffffffffeff8;
      x_02[2] = in_stack_fffffffffffff008;
      x_02[3] = in_stack_fffffffffffff010;
      y_00[0]._1_1_ = uVar46;
      y_00[0]._0_1_ = in_stack_ffffffffffffefd8;
      y_00[0]._2_2_ = uVar47;
      y_00[0]._4_2_ = uVar48;
      y_00[0]._6_1_ = uVar49;
      y_00[0]._7_1_ = uVar50;
      y_00[1] = in_stack_ffffffffffffefe0;
      y_00[2] = in_stack_ffffffffffffefe8;
      y_00[3] = in_stack_ffffffffffffeff0;
      mul_add_epi8(x_02,y_00);
      x_03[1] = in_stack_fffffffffffff000;
      x_03[0] = in_stack_ffffffffffffeff8;
      x_03[2] = in_stack_fffffffffffff008;
      x_03[3] = in_stack_fffffffffffff010;
      y_01[0]._1_1_ = uVar46;
      y_01[0]._0_1_ = in_stack_ffffffffffffefd8;
      y_01[0]._2_2_ = uVar47;
      y_01[0]._4_2_ = uVar48;
      y_01[0]._6_1_ = uVar49;
      y_01[0]._7_1_ = uVar50;
      y_01[1] = in_stack_ffffffffffffefe0;
      y_01[2] = in_stack_ffffffffffffefe8;
      y_01[3] = in_stack_ffffffffffffeff0;
      mul_add_epi8(x_03,y_01);
      auVar11 = vpsignb_avx2(auVar11,auVar12);
      auVar25._16_8_ = uStack_f0;
      auVar25._0_16_ = auVar7;
      auVar25._24_8_ = uStack_e8;
      auVar11 = vpmaddubsw_avx2(auVar25,auVar11);
      auVar12 = vpsignb_avx2(auVar10,auVar13);
      auVar24._16_8_ = uStack_f0;
      auVar24._0_16_ = auVar7;
      auVar24._24_8_ = uStack_e8;
      auVar12 = vpmaddubsw_avx2(auVar24,auVar12);
      auVar14 = vpshufb_avx2(auVar16,local_d40);
      auVar15 = vpshufb_avx2(auVar16,local_d60);
      auVar23._16_8_ = uStack_b0;
      auVar23._0_16_ = auVar5;
      auVar23._24_8_ = uStack_a8;
      local_d40 = vpaddb_avx2(local_d40,auVar23);
      auVar22._16_8_ = uStack_b0;
      auVar22._0_16_ = auVar5;
      auVar22._24_8_ = uStack_a8;
      local_d60 = vpaddb_avx2(local_d60,auVar22);
      auVar27._8_8_ = uStack_338;
      auVar27._0_8_ = local_340;
      auVar27._16_8_ = uStack_330;
      auVar27._24_8_ = uStack_328;
      auVar13 = vpmaddwd_avx2(auVar27,auVar14);
      auVar26._8_8_ = uStack_378;
      auVar26._0_8_ = local_380;
      auVar26._16_8_ = uStack_370;
      auVar26._24_8_ = uStack_368;
      auVar10 = vpmaddwd_avx2(auVar26,auVar15);
      auVar14 = vpmaddwd_avx2(auVar11,auVar14);
      auVar12 = vpmaddwd_avx2(auVar12,auVar15);
      in_stack_fffffffffffff000 = auVar12._0_8_;
      in_stack_fffffffffffff008 = auVar12._8_8_;
      in_stack_fffffffffffff010 = auVar12._16_8_;
      auVar11 = vpaddd_avx2(auVar13,auVar10);
      local_d80 = vpaddd_avx2(local_d80,auVar11);
      auVar11 = vpaddd_avx2(auVar14,auVar12);
      local_da0 = vpaddd_avx2(local_da0,auVar11);
      local_cd8 = local_cd8 + 2;
      local_ce0 = local_ce0 + 1;
    }
    in_stack_ffffffffffffefc0 = *(float *)(in_R9 + (long)local_cc4 * 0x124);
    fVar32 = ggml_lookup_fp16_to_fp32
                       ((ushort)uVar28 >> 0xc | bVar2 & 0xfff0 | uVar3 >> 4 & 0xf00 | uVar4 & 0xf000
                       );
    in_stack_ffffffffffffefc4 = in_stack_ffffffffffffefc0 * fVar32;
    auVar33 = vinsertps_avx(ZEXT416((uint)in_stack_ffffffffffffefc4),
                            ZEXT416((uint)in_stack_ffffffffffffefc4),0x10);
    auVar33 = vinsertps_avx(auVar33,ZEXT416((uint)in_stack_ffffffffffffefc4),0x20);
    auVar33 = vinsertps_avx(auVar33,ZEXT416((uint)in_stack_ffffffffffffefc4),0x30);
    auVar37 = vinsertps_avx(ZEXT416((uint)in_stack_ffffffffffffefc4),
                            ZEXT416((uint)in_stack_ffffffffffffefc4),0x10);
    auVar37 = vinsertps_avx(auVar37,ZEXT416((uint)in_stack_ffffffffffffefc4),0x20);
    auVar37 = vinsertps_avx(auVar37,ZEXT416((uint)in_stack_ffffffffffffefc4),0x30);
    local_140 = auVar37._0_8_;
    uStack_138 = auVar37._8_8_;
    lStack_130 = auVar33._0_8_;
    uStack_128 = auVar33._8_8_;
    auVar16 = vcvtdq2ps_avx(local_d80);
    auVar20._16_8_ = lStack_130;
    auVar20._0_16_ = auVar37;
    auVar20._24_8_ = uStack_128;
    local_ca0._0_16_ = vfmadd213ps_fma(auVar16,auVar20,local_ca0);
    auVar16 = vcvtdq2ps_avx(local_da0);
    auVar19._16_8_ = lStack_130;
    auVar19._0_16_ = auVar37;
    auVar19._24_8_ = uStack_128;
    local_cc0._0_16_ = vfmadd213ps_fma(auVar16,auVar19,local_cc0);
    in_stack_ffffffffffffefe0 = local_140;
    in_stack_ffffffffffffefe8 = uStack_138;
    in_stack_ffffffffffffeff0 = lStack_130;
    in_stack_ffffffffffffeff8 = uStack_128;
  }
  x_00[1] = (float)in_stack_ffffffffffffefbc;
  x_00[0] = (float)in_stack_ffffffffffffefb8;
  x_00[2] = in_stack_ffffffffffffefc0;
  x_00[3] = in_stack_ffffffffffffefc4;
  x_00._16_8_ = in_stack_ffffffffffffefc8;
  x_00._24_6_ = in_stack_ffffffffffffefd0;
  x_00[7]._2_2_ = in_stack_ffffffffffffefd6;
  fVar32 = hsum_float_8(x_00);
  x_01[1] = fVar32;
  x_01[0] = (float)in_stack_ffffffffffffefb8;
  x_01[2] = in_stack_ffffffffffffefc0;
  x_01[3] = in_stack_ffffffffffffefc4;
  x_01._16_8_ = in_stack_ffffffffffffefc8;
  x_01._24_6_ = in_stack_ffffffffffffefd0;
  x_01[7]._2_2_ = in_stack_ffffffffffffefd6;
  auVar36._0_4_ = hsum_float_8(x_01);
  auVar36._4_60_ = extraout_var;
  auVar7 = vfmadd213ss_fma(SUB6416(ZEXT464(0x3e000000),0),auVar36._0_16_,ZEXT416((uint)fVar32));
  *in_RSI = auVar7._0_4_;
  return;
}

Assistant:

void ggml_vec_dot_iq1_m_q8_K  (int n, float * GGML_RESTRICT s, size_t bs, const void * GGML_RESTRICT vx, size_t bx, const void * GGML_RESTRICT vy, size_t by, int nrc) {
    assert(n % QK_K == 0);
    assert(nrc == 1);
    UNUSED(nrc);
    UNUSED(bx);
    UNUSED(by);
    UNUSED(bs);

    const block_iq1_m * GGML_RESTRICT x = vx;
    const block_q8_K  * GGML_RESTRICT y = vy;

    const int nb = n / QK_K;

    iq1m_scale_t scale;

#if defined __ARM_NEON
    const int32x4_t mask  = vdupq_n_s32(0x7);
    const int32x4_t mone  = vdupq_n_s32(1);
    const int32x4_t mzero = vdupq_n_s32(0);

    ggml_int8x16x4_t deltas;
    deltas.val[0] = vcombine_s8(vdup_n_s8(+1), vdup_n_s8(+1));
    deltas.val[1] = vcombine_s8(vdup_n_s8(-1), vdup_n_s8(+1));
    deltas.val[2] = vcombine_s8(vdup_n_s8(+1), vdup_n_s8(-1));
    deltas.val[3] = vcombine_s8(vdup_n_s8(-1), vdup_n_s8(-1));

    ggml_int8x16x4_t q1b;
    ggml_int8x16x4_t q8b;

    uint32_t aux32;
    const uint8_t * aux8 = (const uint8_t *)&aux32;

    float sumf = 0;
    for (int i = 0; i < nb; ++i) {

        const int8_t   * q8 = y[i].qs;
        const uint8_t  * qs = x[i].qs;
        const uint8_t  * qh = x[i].qh;
        const uint16_t * sc = (const uint16_t *)x[i].scales;

        scale.u16 = (sc[0] >> 12) | ((sc[1] >> 8) & 0x00f0) | ((sc[2] >> 4) & 0x0f00) | (sc[3] & 0xf000);

        int32x4_t sumi1 = mzero;
        int32x4_t sumi2 = mzero;

        for (int ib = 0; ib < QK_K/32; ib += 2) {

            q1b.val[0] = vcombine_s8(vld1_s8((const int8_t *)(iq1s_grid + (qs[0] | ((qh[0] << 8) & 0x700)))),
                                     vld1_s8((const int8_t *)(iq1s_grid + (qs[1] | ((qh[0] << 4) & 0x700)))));
            q1b.val[1] = vcombine_s8(vld1_s8((const int8_t *)(iq1s_grid + (qs[2] | ((qh[1] << 8) & 0x700)))),
                                     vld1_s8((const int8_t *)(iq1s_grid + (qs[3] | ((qh[1] << 4) & 0x700)))));
            q1b.val[2] = vcombine_s8(vld1_s8((const int8_t *)(iq1s_grid + (qs[4] | ((qh[2] << 8) & 0x700)))),
                                     vld1_s8((const int8_t *)(iq1s_grid + (qs[5] | ((qh[2] << 4) & 0x700)))));
            q1b.val[3] = vcombine_s8(vld1_s8((const int8_t *)(iq1s_grid + (qs[6] | ((qh[3] << 8) & 0x700)))),
                                     vld1_s8((const int8_t *)(iq1s_grid + (qs[7] | ((qh[3] << 4) & 0x700)))));

            q8b = ggml_vld1q_s8_x4(q8); q8 += 64;

            const int32x4_t p1 = vpaddq_s32(ggml_vdotq_s32(mzero, q1b.val[0], q8b.val[0]), ggml_vdotq_s32(mzero, q1b.val[1], q8b.val[1]));
            const int32x4_t p2 = vpaddq_s32(ggml_vdotq_s32(mzero, q1b.val[2], q8b.val[2]), ggml_vdotq_s32(mzero, q1b.val[3], q8b.val[3]));
            const int32x4_t p12 = vpaddq_s32(p1, p2);

            const uint32_t * qh32 = (const uint32_t *)qh; // we are 4-byte aligned, so we can do that
            aux32 = ((qh32[0] >> 3) & 0x01010101) | ((qh32[0] >> 6) & 0x02020202);

            const int32x4_t p3 = vpaddq_s32(ggml_vdotq_s32(mzero, deltas.val[aux8[0]], q8b.val[0]), ggml_vdotq_s32(mzero, deltas.val[aux8[1]], q8b.val[1]));
            const int32x4_t p4 = vpaddq_s32(ggml_vdotq_s32(mzero, deltas.val[aux8[2]], q8b.val[2]), ggml_vdotq_s32(mzero, deltas.val[aux8[3]], q8b.val[3]));
            const int32x4_t p34 = vpaddq_s32(p3, p4);

            int32x4_t scales_4 = ggml_vld1q_u32(sc[ib/2] >> 0, sc[ib/2] >> 3, sc[ib/2] >> 6, sc[ib/2] >> 9);

            scales_4 = vaddq_s32(vshlq_n_s32(vandq_s32(scales_4, mask), 1), mone);

            sumi1 = vmlaq_s32(sumi1, scales_4, p12);
            sumi2 = vmlaq_s32(sumi2, scales_4, p34);

            qs += 8; qh += 4;

        }

        sumf += y[i].d * GGML_FP16_TO_FP32(scale.f16) * (vaddvq_s32(sumi1) + IQ1M_DELTA * vaddvq_s32(sumi2));
    }

    *s = sumf;

#elif defined __AVX2__

    const __m256i mask = _mm256_set1_epi16(0x7);
    const __m256i mone = _mm256_set1_epi16(1);
    const __m256i mone8 = _mm256_set1_epi8(1);
    const __m256i mtwo8 = _mm256_set1_epi8(2);
    // VPSHUFB cannot cross 128-bit lanes so odd shifts go to upper half.
    const __m256i scales_shift = _mm256_set_epi64x(9, 3, 6, 0);

    __m256 accum1 = _mm256_setzero_ps();
    __m256 accum2 = _mm256_setzero_ps();
    for (int i = 0; i < nb; ++i) {

        const int8_t   * q8 = y[i].qs;
        const uint8_t  * qs = x[i].qs;
        const uint8_t  * qh = x[i].qh;
        const uint16_t * sc = (const uint16_t *)x[i].scales;

        scale.u16 = (sc[0] >> 12) | ((sc[1] >> 8) & 0x00f0) | ((sc[2] >> 4) & 0x0f00) | (sc[3] & 0xf000);
        // Extract 3-bit scales (16 values)
        __m256i scales = _mm256_set1_epi64x(*(const uint64_t*)sc);
        scales = _mm256_srlv_epi64(scales, scales_shift);
        scales = _mm256_add_epi16(_mm256_slli_epi16(_mm256_and_si256(scales, mask), 1), mone);

        // Indices to repeat each scale 8 times.
        __m256i scales_idx1 = _mm256_set1_epi16(0x0100);
        __m256i scales_idx2 = _mm256_add_epi8(scales_idx1, _mm256_set1_epi8(8));

        __m256i sumi1 = _mm256_setzero_si256();
        __m256i sumi2 = _mm256_setzero_si256();
        for (int ib = 0; ib < QK_K/32; ib += 2) {
#ifdef __BMI2__
            const uint64_t packed_idx1 = _pdep_u64(*(const uint32_t *)qs, 0x00ff00ff00ff00ffULL)
                                       | _pdep_u64(*(const uint16_t*)(qh) & 0x7777, 0xf000f000f000f00ULL);
            const uint64_t packed_idx2 = _pdep_u64(*(const uint32_t *)(qs + 4), 0x00ff00ff00ff00ffULL)
                                       | _pdep_u64(*(const uint16_t*)(qh + 2) & 0x7777, 0xf000f000f000f00ULL);
            const uint16_t *idx1 = (const uint16_t *)(&packed_idx1);
            const uint16_t *idx2 = (const uint16_t *)(&packed_idx2);
            const __m256i q1b_1 = _mm256_set_epi64x(iq1s_grid[idx1[3]], iq1s_grid[idx1[2]], iq1s_grid[idx1[1]], iq1s_grid[idx1[0]]);
            const __m256i q1b_2 = _mm256_set_epi64x(iq1s_grid[idx2[3]], iq1s_grid[idx2[2]], iq1s_grid[idx2[1]], iq1s_grid[idx2[0]]);

            // Convert signs to bytes 0x81 (negative) or 0x01 (positive)
            const uint64_t delta_sign = _pdep_u64(*(const uint32_t*)(qh) & 0x88888888, 0xf0f0f0f0f0f0f0f0ULL);
            const __m256i delta1 = _mm256_or_si256(mone8, _mm256_cvtepi8_epi64(_mm_set1_epi32(delta_sign)));
            const __m256i delta2 = _mm256_or_si256(mone8, _mm256_cvtepi8_epi64(_mm_set1_epi32(delta_sign >> 32)));
#else
            const __m256i q1b_1 = _mm256_set_epi64x(
                    iq1s_grid[qs[3] | (((uint16_t)qh[1] << 4) & 0x700)], iq1s_grid[qs[2] | (((uint16_t)qh[1] << 8) & 0x700)],
                    iq1s_grid[qs[1] | (((uint16_t)qh[0] << 4) & 0x700)], iq1s_grid[qs[0] | (((uint16_t)qh[0] << 8) & 0x700)]
            );
            const __m256i q1b_2 = _mm256_set_epi64x(
                    iq1s_grid[qs[7] | (((uint16_t)qh[3] << 4) & 0x700)], iq1s_grid[qs[6] | (((uint16_t)qh[3] << 8) & 0x700)],
                    iq1s_grid[qs[5] | (((uint16_t)qh[2] << 4) & 0x700)], iq1s_grid[qs[4] | (((uint16_t)qh[2] << 8) & 0x700)]
            );

            const __m256i delta1 = _mm256_set_epi64x(qh[1] & 0x80 ? 0xffffffffffffffff : 0x0101010101010101,
                                                     qh[1] & 0x08 ? 0xffffffffffffffff : 0x0101010101010101,
                                                     qh[0] & 0x80 ? 0xffffffffffffffff : 0x0101010101010101,
                                                     qh[0] & 0x08 ? 0xffffffffffffffff : 0x0101010101010101);
            const __m256i delta2 = _mm256_set_epi64x(qh[3] & 0x80 ? 0xffffffffffffffff : 0x0101010101010101,
                                                     qh[3] & 0x08 ? 0xffffffffffffffff : 0x0101010101010101,
                                                     qh[2] & 0x80 ? 0xffffffffffffffff : 0x0101010101010101,
                                                     qh[2] & 0x08 ? 0xffffffffffffffff : 0x0101010101010101);
#endif
            const __m256i q8b_1 = _mm256_loadu_si256((const __m256i*)q8); q8 += 32;
            const __m256i q8b_2 = _mm256_loadu_si256((const __m256i*)q8); q8 += 32;

            const __m256i dot1 = mul_add_epi8(q1b_1, q8b_1);
            const __m256i dot2 = mul_add_epi8(q1b_2, q8b_2);
            const __m256i dot3 = _mm256_maddubs_epi16(mone8, _mm256_sign_epi8(q8b_1, delta1));
            const __m256i dot4 = _mm256_maddubs_epi16(mone8, _mm256_sign_epi8(q8b_2, delta2));

            __m256i scale1 = _mm256_shuffle_epi8(scales, scales_idx1);
            __m256i scale2 = _mm256_shuffle_epi8(scales, scales_idx2);

            scales_idx1 = _mm256_add_epi8(scales_idx1, mtwo8);
            scales_idx2 = _mm256_add_epi8(scales_idx2, mtwo8);

            const __m256i p1 = _mm256_madd_epi16(dot1, scale1);
            const __m256i p2 = _mm256_madd_epi16(dot2, scale2);
            const __m256i p3 = _mm256_madd_epi16(dot3, scale1);
            const __m256i p4 = _mm256_madd_epi16(dot4, scale2);

            sumi1 = _mm256_add_epi32(sumi1, _mm256_add_epi32(p1, p2));
            sumi2 = _mm256_add_epi32(sumi2, _mm256_add_epi32(p3, p4));

            qs += 8; qh += 4;
        }

        const __m256 d = _mm256_set1_ps(y[i].d * GGML_FP16_TO_FP32(scale.f16));

        accum1 = _mm256_fmadd_ps(d, _mm256_cvtepi32_ps(sumi1), accum1);
        accum2 = _mm256_fmadd_ps(d, _mm256_cvtepi32_ps(sumi2), accum2);
    }

    *s = hsum_float_8(accum1) + IQ1M_DELTA * hsum_float_8(accum2);

#elif defined __AVX__
    const __m128i mask = _mm_set1_epi16(0x7);
    const __m128i mone = _mm_set1_epi16(1);

    __m256 accum1 = _mm256_setzero_ps();
    __m256 accum2 = _mm256_setzero_ps();
    for (int i = 0; i < nb; ++i) {

        const int8_t   * q8 = y[i].qs;
        const uint8_t  * qs = x[i].qs;
        const uint8_t  * qh = x[i].qh;
        const uint16_t * sc = (const uint16_t *)x[i].scales;

        scale.u16 = (sc[0] >> 12) | ((sc[1] >> 8) & 0x00f0) | ((sc[2] >> 4) & 0x0f00) | (sc[3] & 0xf000);

        __m128i sumi1_0 = _mm_setzero_si128();
        __m128i sumi1_1 = _mm_setzero_si128();
        __m128i sumi2_0 = _mm_setzero_si128();
        __m128i sumi2_1 = _mm_setzero_si128();
        for (int ib = 0; ib < QK_K/32; ib += 2) {
            const __m128i q1b_1_0 = _mm_set_epi64x(
                    iq1s_grid[qs[1] | (((uint16_t)qh[0] << 4) & 0x700)], iq1s_grid[qs[0] | (((uint16_t)qh[0] << 8) & 0x700)]);
            const __m128i q1b_1_1 = _mm_set_epi64x(
                    iq1s_grid[qs[3] | (((uint16_t)qh[1] << 4) & 0x700)], iq1s_grid[qs[2] | (((uint16_t)qh[1] << 8) & 0x700)]);
            const __m128i q1b_2_0 = _mm_set_epi64x(
                    iq1s_grid[qs[5] | (((uint16_t)qh[2] << 4) & 0x700)], iq1s_grid[qs[4] | (((uint16_t)qh[2] << 8) & 0x700)]);
            const __m128i q1b_2_1 = _mm_set_epi64x(
                    iq1s_grid[qs[7] | (((uint16_t)qh[3] << 4) & 0x700)], iq1s_grid[qs[6] | (((uint16_t)qh[3] << 8) & 0x700)]);
            const __m128i q8b_1_0 = _mm_loadu_si128((const __m128i *)q8); q8 += 16;
            const __m128i q8b_1_1 = _mm_loadu_si128((const __m128i *)q8); q8 += 16;
            const __m128i q8b_2_0 = _mm_loadu_si128((const __m128i *)q8); q8 += 16;
            const __m128i q8b_2_1 = _mm_loadu_si128((const __m128i *)q8); q8 += 16;

            const __m128i dot1_0 = mul_add_epi8_sse(q1b_1_0, q8b_1_0);
            const __m128i dot1_1 = mul_add_epi8_sse(q1b_1_1, q8b_1_1);
            const __m128i dot2_0 = mul_add_epi8_sse(q1b_2_0, q8b_2_0);
            const __m128i dot2_1 = mul_add_epi8_sse(q1b_2_1, q8b_2_1);

            const __m128i delta1_0 = _mm_set_epi64x(qh[0] & 0x80 ? 0xffffffffffffffff : 0x0101010101010101,
                                                     qh[0] & 0x08 ? 0xffffffffffffffff : 0x0101010101010101);
            const __m128i delta1_1 = _mm_set_epi64x(qh[1] & 0x80 ? 0xffffffffffffffff : 0x0101010101010101,
                                                     qh[1] & 0x08 ? 0xffffffffffffffff : 0x0101010101010101);
            const __m128i delta2_0 = _mm_set_epi64x(qh[2] & 0x80 ? 0xffffffffffffffff : 0x0101010101010101,
                                                     qh[2] & 0x08 ? 0xffffffffffffffff : 0x0101010101010101);
            const __m128i delta2_1 = _mm_set_epi64x(qh[3] & 0x80 ? 0xffffffffffffffff : 0x0101010101010101,
                                                     qh[3] & 0x08 ? 0xffffffffffffffff : 0x0101010101010101);

            const __m128i dot3_0 = mul_add_epi8_sse(delta1_0, q8b_1_0);
            const __m128i dot3_1 = mul_add_epi8_sse(delta1_1, q8b_1_1);
            const __m128i dot4_0 = mul_add_epi8_sse(delta2_0, q8b_2_0);
            const __m128i dot4_1 = mul_add_epi8_sse(delta2_1, q8b_2_1);

            __m128i scale1_0 = _mm_set1_epi16(sc[ib/2] >> 0);
            __m128i scale1_1 = _mm_set1_epi16(sc[ib/2] >> 3);
            __m128i scale2_0 = _mm_set1_epi16(sc[ib/2] >> 6);
            __m128i scale2_1 = _mm_set1_epi16(sc[ib/2] >> 9);

            scale1_0 = _mm_add_epi16(_mm_slli_epi16(_mm_and_si128(scale1_0, mask), 1), mone);
            scale1_1 = _mm_add_epi16(_mm_slli_epi16(_mm_and_si128(scale1_1, mask), 1), mone);
            scale2_0 = _mm_add_epi16(_mm_slli_epi16(_mm_and_si128(scale2_0, mask), 1), mone);
            scale2_1 = _mm_add_epi16(_mm_slli_epi16(_mm_and_si128(scale2_1, mask), 1), mone);
            const __m128i p1_0 = _mm_madd_epi16(dot1_0, scale1_0);
            const __m128i p1_1 = _mm_madd_epi16(dot1_1, scale1_1);
            const __m128i p2_0 = _mm_madd_epi16(dot2_0, scale2_0);
            const __m128i p2_1 = _mm_madd_epi16(dot2_1, scale2_1);
            const __m128i p3_0 = _mm_madd_epi16(dot3_0, scale1_0);
            const __m128i p3_1 = _mm_madd_epi16(dot3_1, scale1_1);
            const __m128i p4_0 = _mm_madd_epi16(dot4_0, scale2_0);
            const __m128i p4_1 = _mm_madd_epi16(dot4_1, scale2_1);

            sumi1_0 = _mm_add_epi32(sumi1_0, _mm_add_epi32(p1_0, p2_0));
            sumi1_1 = _mm_add_epi32(sumi1_1, _mm_add_epi32(p1_1, p2_1));
            sumi2_0 = _mm_add_epi32(sumi2_0, _mm_add_epi32(p3_0, p4_0));
            sumi2_1 = _mm_add_epi32(sumi2_1, _mm_add_epi32(p3_1, p4_1));

            qs += 8; qh += 4;
        }

        const __m256 d = _mm256_set1_ps(y[i].d * GGML_FP16_TO_FP32(scale.f16));

        accum1 = _mm256_add_ps(_mm256_mul_ps(d, _mm256_cvtepi32_ps(MM256_SET_M128I(sumi1_1, sumi1_0))), accum1);
        accum2 = _mm256_add_ps(_mm256_mul_ps(d, _mm256_cvtepi32_ps(MM256_SET_M128I(sumi2_1, sumi2_0))), accum2);
    }

    *s = hsum_float_8(accum1) + IQ1M_DELTA * hsum_float_8(accum2);

#else

    int sum1[2], sum2[2], delta[4];

    float sumf = 0;
    for (int i = 0; i < nb; i++) {

        const int8_t   * q8 = y[i].qs;
        const uint8_t  * qs = x[i].qs;
        const uint8_t  * qh = x[i].qh;
        const uint16_t * sc = (const uint16_t *)x[i].scales;

        scale.u16 = (sc[0] >> 12) | ((sc[1] >> 8) & 0x00f0) | ((sc[2] >> 4) & 0x0f00) | (sc[3] & 0xf000);

        int sumi1 = 0, sumi2 = 0;
        for (int ib = 0; ib < QK_K/32; ++ib) {
            delta[0] = qh[0] & 0x08 ? -1 : 1;
            delta[1] = qh[0] & 0x80 ? -1 : 1;
            delta[2] = qh[1] & 0x08 ? -1 : 1;
            delta[3] = qh[1] & 0x80 ? -1 : 1;
            sum1[0] = sum1[1] = sum2[0] = sum2[1] = 0;
            for (int l = 0; l < 4; ++l) {
                const int8_t * grid = (const int8_t *)(iq1s_grid + (qs[l] | (((uint16_t)qh[l/2] << (8 - 4*(l%2))) & 0x700)));
                int lsum1 = 0, lsum2 = 0;
                for (int j = 0; j < 8; ++j) {
                    lsum1 += q8[j] * grid[j];
                    lsum2 += q8[j];
                }
                q8 += 8;
                sum1[l/2] += lsum1;
                sum2[l/2] += lsum2*delta[l];
            }

            const int ls1 = 2*((sc[ib/2] >> (6*(ib%2)+0)) & 0x7) + 1;
            const int ls2 = 2*((sc[ib/2] >> (6*(ib%2)+3)) & 0x7) + 1;

            sumi1 += sum1[0] * ls1 + sum1[1] * ls2;
            sumi2 += sum2[0] * ls1 + sum2[1] * ls2;
            qs += 4;
            qh += 2;
        }

        sumf += GGML_FP16_TO_FP32(scale.f16) * y[i].d * (sumi1 + IQ1M_DELTA * sumi2);
    }

    *s = sumf;

#endif
}